

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_features.c
# Opt level: O1

void av1_set_speed_features_framesize_dependent(AV1_COMP *cpi,int speed)

{
  int *piVar1;
  MODE MVar2;
  byte bVar3;
  AV1_PRIMARY *pAVar4;
  SequenceHeader *pSVar5;
  byte bVar6;
  code *pcVar7;
  _Bool _Var8;
  int i;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  BLOCK_SIZE BVar13;
  int iVar14;
  int iVar15;
  undefined4 uVar16;
  int iVar17;
  bool bVar18;
  int iVar19;
  long lVar20;
  int64_t iVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  
  MVar2 = (cpi->oxcf).mode;
  if (MVar2 == '\x02') {
    iVar17 = (cpi->common).width;
    iVar15 = (cpi->common).height;
    if (iVar17 < iVar15) {
      iVar15 = iVar17;
    }
    _Var8 = (cpi->oxcf).use_highbitdepth;
    if (iVar15 < 0x1e0) {
      (cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_64X64;
      (cpi->sf).part_sf.auto_max_partition_based_on_simple_motion = '\x01';
      if (_Var8 != false) {
        (cpi->sf).tx_sf.prune_tx_size_level = 1;
      }
    }
    else {
      (cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_128X128;
      if (iVar15 < 0x2d0) {
        (cpi->sf).part_sf.auto_max_partition_based_on_simple_motion = '\x02';
      }
      else {
        (cpi->sf).part_sf.auto_max_partition_based_on_simple_motion = '\x03';
      }
    }
    if (0x86f < iVar15) {
      (cpi->sf).part_sf.default_min_partition_size = BLOCK_8X8;
    }
    if (iVar15 < 0x2d0) {
      (cpi->sf).part_sf.ml_partition_search_breakout_thresh[0] = 200;
      (cpi->sf).part_sf.ml_partition_search_breakout_thresh[1] = 0xfa;
      (cpi->sf).part_sf.ml_partition_search_breakout_thresh[2] = 300;
      (cpi->sf).part_sf.ml_partition_search_breakout_thresh[3] = 500;
      (cpi->sf).part_sf.ml_partition_search_breakout_thresh[4] = -1;
      (cpi->sf).part_sf.ml_early_term_after_part_split_level = 1;
    }
    else {
      (cpi->sf).mv_sf.use_downsampled_sad = 2;
    }
    if (0 < speed) {
      BVar13 = BLOCK_128X128;
      if (iVar15 < 0x2d0) {
        BVar13 = (0x1df < iVar15) * '\x03' + BLOCK_32X32;
      }
      (cpi->sf).part_sf.use_square_partition_only_threshold = BVar13;
      if (iVar15 < 0x2d0) {
        (cpi->sf).part_sf.ml_partition_search_breakout_thresh[0] = 200;
        (cpi->sf).part_sf.ml_partition_search_breakout_thresh[1] = 0xfa;
        (cpi->sf).part_sf.ml_partition_search_breakout_thresh[2] = 300;
        (cpi->sf).part_sf.ml_partition_search_breakout_thresh[3] = 300;
        (cpi->sf).part_sf.ml_partition_search_breakout_thresh[4] = -1;
      }
      (cpi->sf).part_sf.ml_early_term_after_part_split_level = 2;
    }
    if (1 < speed) {
      iVar21 = 0x1000000;
      if (iVar15 < 0x2d0) {
        iVar21 = 0x400000;
      }
      iVar17 = 0x78;
      if (iVar15 < 0x2d0) {
        iVar17 = 100;
      }
      (cpi->sf).part_sf.use_square_partition_only_threshold =
           (0x2cf < iVar15) * '\x03' + BLOCK_32X32;
      (cpi->sf).part_sf.partition_search_breakout_dist_thr = iVar21;
      (cpi->sf).part_sf.partition_search_breakout_rate_thr = iVar17;
      if (iVar15 < 0x1e0) {
        iVar17 = 3;
      }
      else {
        (cpi->sf).tx_sf.tx_type_search.prune_tx_type_using_stats = 1;
        iVar17 = 2;
      }
      if (_Var8 != false) {
        (cpi->sf).tx_sf.prune_tx_size_level = iVar17;
      }
    }
    if (2 < speed) {
      (cpi->sf).part_sf.ml_early_term_after_part_split_level = 0;
      if (iVar15 < 0x2d0) {
        (cpi->sf).part_sf.max_intra_bsize = BLOCK_32X32;
        iVar17 = 0x78;
        iVar21 = 0x800000;
      }
      else {
        iVar17 = 200;
        iVar21 = 0x2000000;
      }
      (cpi->sf).part_sf.partition_search_breakout_dist_thr = iVar21;
      (cpi->sf).part_sf.partition_search_breakout_rate_thr = iVar17;
      if (_Var8 != false) {
        (cpi->sf).tx_sf.prune_tx_size_level = 3;
      }
    }
    if (3 < speed) {
      iVar21 = 0x4000000;
      if (iVar15 < 0x2d0) {
        iVar21 = 0x1000000;
      }
      (cpi->sf).part_sf.partition_search_breakout_dist_thr = iVar21;
      if (0x1df < iVar15) {
        (cpi->sf).tx_sf.tx_type_search.prune_tx_type_using_stats = 2;
      }
    }
    if (5 < speed) {
      if (0x1df < iVar15) {
        (cpi->sf).part_sf.auto_max_partition_based_on_simple_motion = iVar15 < 0x2d0;
      }
      if (0x437 < iVar15) {
        (cpi->sf).part_sf.default_min_partition_size = BLOCK_8X8;
      }
      (cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_16X16;
    }
    if (7 < speed) {
      if (iVar15 < 0x1e0) {
        (cpi->sf).rt_sf.nonrd_check_partition_merge_mode = 2;
      }
      if (0x2cf < iVar15) {
        (cpi->sf).rt_sf.force_large_partition_blocks_intra = 1;
      }
    }
    if (8 < speed && iVar15 < 0x870) {
      (cpi->sf).inter_sf.coeff_cost_upd_level = INTERNAL_COST_UPD_OFF;
      (cpi->sf).inter_sf.mode_cost_upd_level = INTERNAL_COST_UPD_OFF;
    }
  }
  else if (MVar2 == '\x01') {
    pAVar4 = cpi->ppi;
    bVar23 = ((cpi->common).current_frame.frame_type & 0xfd) != 0;
    bVar24 = ((pAVar4->gf_group).update_type[cpi->gf_frame_index] & 0xfe) != 2;
    bVar22 = bVar24 && bVar23;
    iVar17 = (cpi->common).width;
    iVar15 = (cpi->common).height;
    iVar14 = iVar15;
    if (iVar17 < iVar15) {
      iVar14 = iVar17;
    }
    if (iVar14 < 0x168) {
      (cpi->sf).rt_sf.prune_intra_mode_based_on_mv_range = BLOCK_4X8;
      (cpi->sf).rt_sf.prune_inter_modes_wrt_gf_arf_based_on_sad = 1;
      if (5 < speed) {
        (cpi->sf).winner_mode_sf.prune_winner_mode_eval_level = (uint)bVar22 * 2;
      }
      if (speed == 7) {
        (cpi->sf).rt_sf.prefer_large_partition_blocks = 2;
      }
      if (6 < speed) {
        (cpi->sf).lpf_sf.cdef_pick_method = CDEF_PICK_FROM_Q;
        (cpi->sf).rt_sf.check_only_zero_zeromv_on_large_blocks = true;
        (cpi->sf).rt_sf.use_rtc_tf = 2;
      }
      if (speed == 8) {
        (cpi->sf).rt_sf.prefer_large_partition_blocks = 1;
      }
      if (7 < speed) {
        (cpi->sf).rt_sf.use_nonrd_filter_search = 1;
        (cpi->sf).rt_sf.tx_size_level_based_on_qstep = 1;
      }
      if (8 < speed) {
        (cpi->sf).rt_sf.use_comp_ref_nonrd = 0;
        (cpi->sf).rt_sf.nonrd_aggressive_skip = 1;
        (cpi->sf).rt_sf.skip_intra_pred = 1;
        (cpi->sf).rt_sf.enable_ref_short_signaling = (cpi->sf).rt_sf.use_nonrd_altref_frame == 0;
        (cpi->sf).rt_sf.use_adaptive_subpel_search = false;
      }
      if (9 < speed) {
        (cpi->sf).rt_sf.skip_intra_pred = 2;
        (cpi->sf).rt_sf.estimate_motion_for_var_based_partition = 0;
        (cpi->sf).rt_sf.hybrid_intra_pickmode = 3;
        (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion = 2;
        (cpi->sf).rt_sf.reduce_mv_pel_precision_lowcomplex = 1;
        (cpi->sf).rt_sf.use_nonrd_filter_search = 0;
      }
    }
    else {
      (cpi->sf).rt_sf.prune_intra_mode_based_on_mv_range = BLOCK_8X4;
      (cpi->sf).intra_sf.skip_filter_intra_in_inter_frames = 1;
      if (speed < 6) {
        iVar19 = 0x7fffffff;
        if (bVar24 && bVar23) {
          iVar19 = 0x15e;
        }
        (cpi->sf).tx_sf.tx_type_search.fast_inter_tx_type_prob_thresh = iVar19;
        (cpi->sf).winner_mode_sf.prune_winner_mode_eval_level = (uint)bVar22 * 2;
      }
      if (speed == 6) {
        (cpi->sf).part_sf.disable_8x8_part_based_on_qidx = 1;
      }
      if (5 < speed) {
        (cpi->sf).rt_sf.skip_newmv_mode_based_on_sse = 2;
      }
      if ((((speed == 7) && ((cpi->sf).rt_sf.prefer_large_partition_blocks = 1, iVar14 < 0x2d1)) &&
          ((cpi->rc).rtc_external_ratectrl == 0)) && ((cpi->oxcf).use_highbitdepth == false)) {
        (cpi->sf).hl_sf.accurate_bit_estimate = (uint)((cpi->oxcf).q_cfg.aq_mode == '\0');
      }
      if (6 < speed) {
        (cpi->sf).rt_sf.use_rtc_tf = 1;
      }
      if ((speed == 8) && (pAVar4->use_svc == 0)) {
        (cpi->sf).rt_sf.short_circuit_low_temp_var = 0;
        (cpi->sf).rt_sf.use_nonrd_altref_frame = 1;
      }
      if (7 < speed) {
        (cpi->sf).rt_sf.tx_size_level_based_on_qstep = 2;
      }
      if (8 < speed) {
        (cpi->sf).rt_sf.gf_length_lvl = 1;
        (cpi->sf).rt_sf.skip_cdef_sb = 1;
        (cpi->sf).rt_sf.sad_based_adp_altref_lag = 2;
        (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion = 2;
        (cpi->sf).rt_sf.use_adaptive_subpel_search = true;
        (cpi->sf).interp_sf.cb_pred_filter_search = 1;
      }
      if (9 < speed) {
        (cpi->sf).rt_sf.hybrid_intra_pickmode = 2;
        (cpi->sf).rt_sf.sad_based_adp_altref_lag = 4;
        (cpi->sf).rt_sf.tx_size_level_based_on_qstep = 0;
        (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion = 3;
        (cpi->sf).rt_sf.use_adaptive_subpel_search = false;
        (cpi->sf).interp_sf.cb_pred_filter_search = 2;
      }
    }
    if (speed == 7 && iVar14 < 0x1e0) {
      (cpi->sf).rt_sf.nonrd_check_partition_merge_mode = 2;
    }
    if (iVar14 < 0x2d0) {
      if (8 < speed) {
        uVar16 = 1;
        lVar12 = 0x60d5c;
        goto LAB_0022c041;
      }
    }
    else {
      if (5 < speed) {
        (cpi->sf).rt_sf.skip_newmv_mode_based_on_sse = 3;
      }
      if (speed == 7) {
        (cpi->sf).rt_sf.prefer_large_partition_blocks = 0;
      }
      if (6 < speed) {
        (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion = 1;
        (cpi->sf).rt_sf.reduce_mv_pel_precision_lowcomplex = 2;
      }
      if (8 < speed) {
        (cpi->sf).rt_sf.sad_based_adp_altref_lag = 1;
        (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion = 2;
        (cpi->sf).rt_sf.reduce_mv_pel_precision_lowcomplex = 0;
      }
      if (9 < speed) {
        (cpi->sf).rt_sf.sad_based_adp_altref_lag = 3;
        uVar16 = 3;
        lVar12 = 0x60d80;
LAB_0022c041:
        *(undefined4 *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar12) =
             uVar16;
      }
    }
    if (iVar14 < 0x438) {
      if (8 < speed) {
        (cpi->sf).lpf_sf.cdef_pick_method = CDEF_PICK_FROM_Q;
      }
      if (9 < speed) {
        (cpi->sf).rt_sf.nonrd_aggressive_skip = 1;
      }
    }
    else {
      if (6 < speed) {
        (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion = 0;
        (cpi->sf).rt_sf.use_adaptive_subpel_search = false;
      }
      if (8 < speed) {
        (cpi->sf).interp_sf.cb_pred_filter_search = 0;
      }
    }
    if ((10 < speed) && ((cpi->oxcf).tune_cfg.content != AOM_CONTENT_SCREEN)) {
      (cpi->sf).rt_sf.skip_cdef_sb = 1;
      (cpi->sf).rt_sf.selective_cdf_update = 1;
      (cpi->sf).rt_sf.force_only_last_ref = 1;
      (cpi->sf).rt_sf.use_nonrd_filter_search = 0;
      if (0x167 < iVar14) {
        (cpi->sf).part_sf.fixed_partition_size = BLOCK_32X32;
        (cpi->sf).rt_sf.use_fast_fixed_part = 1;
        (cpi->sf).rt_sf.reduce_mv_pel_precision_lowcomplex = 2;
      }
      (cpi->sf).rt_sf.increase_source_sad_thresh = 1;
      (cpi->sf).rt_sf.part_early_exit_zeromv = 2;
      (cpi->sf).rt_sf.set_zeromv_skip_based_on_source_sad = 2;
      lVar12 = 0;
      do {
        piVar1 = (cpi->sf).rt_sf.intra_y_mode_bsize_mask_nrd + lVar12;
        piVar1[0] = 1;
        piVar1[1] = 1;
        piVar1[2] = 1;
        piVar1[3] = 1;
        lVar12 = lVar12 + 4;
      } while (lVar12 != 0x10);
      (cpi->sf).rt_sf.hybrid_intra_pickmode = 0;
    }
    if ((pAVar4->use_svc != 0) || ((pAVar4->rtc_ref).set_ref_frame_config != 0)) {
      iVar14 = (cpi->svc).number_temporal_layers;
      if (((1 < iVar14) && ((cpi->svc).temporal_layer_id == 0)) &&
         (((cpi->svc).spatial_layer_id == 0 ||
          ((cpi->oxcf).frm_dim_cfg.height * (cpi->oxcf).frm_dim_cfg.width < 0x38401)))) {
        (cpi->sf).mv_sf.search_method = '\x01';
        (cpi->sf).mv_sf.subpel_search_method = '\x01';
        (cpi->sf).rt_sf.fullpel_search_step_param = 10;
        (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion = 0;
        if (iVar15 * iVar17 < 0x18c01) {
          (cpi->sf).rt_sf.nonrd_prune_ref_frame_search = 2;
        }
        (cpi->sf).rt_sf.force_large_partition_blocks_intra = 0;
      }
      if (7 < speed) {
        if (2 < iVar14) {
          (cpi->sf).rt_sf.disable_cdf_update_non_reference_frame = true;
        }
        (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion = 3;
        if ((pAVar4->rtc_ref).non_reference_frame != 0) {
          (cpi->sf).rt_sf.nonrd_aggressive_skip = 1;
          (cpi->sf).mv_sf.subpel_search_method = '\x02';
        }
      }
      if ((iVar14 < 3 || 9 < speed) || ((cpi->svc).temporal_layer_id != 0)) {
        _Var8 = true;
      }
      else {
        _Var8 = false;
      }
      (cpi->sf).rt_sf.check_only_zero_zeromv_on_large_blocks = _Var8;
      (cpi->sf).rt_sf.frame_level_mode_cost_update = false;
      if ((((pAVar4->rtc_ref).ref_frame_comp[0] == 0) && ((pAVar4->rtc_ref).ref_frame_comp[1] == 0))
         && ((pAVar4->rtc_ref).ref_frame_comp[2] == 0)) {
        uVar11 = 0;
        lVar12 = 0x60cb8;
      }
      else {
        (cpi->sf).rt_sf.use_comp_ref_nonrd = 1;
        uVar11 = 0;
        uVar10 = 0;
        if ((pAVar4->rtc_ref).ref_frame_comp[0] != 0) {
          uVar10 = (uint)((pAVar4->rtc_ref).reference[3] != 0);
        }
        (cpi->sf).rt_sf.ref_frame_comp_nonrd[0] = uVar10;
        if ((pAVar4->rtc_ref).ref_frame_comp[1] != 0) {
          uVar11 = (uint)((pAVar4->rtc_ref).reference[1] != 0);
        }
        (cpi->sf).rt_sf.ref_frame_comp_nonrd[1] = uVar11;
        lVar12 = 0x60cc4;
        if ((pAVar4->rtc_ref).ref_frame_comp[2] == 0) {
          uVar11 = 0;
        }
        else {
          uVar11 = (uint)((pAVar4->rtc_ref).reference[6] != 0);
        }
      }
      *(uint *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar12) = uVar11;
      if ((1 < iVar14) || (1 < (cpi->svc).number_spatial_layers)) {
        (cpi->sf).hl_sf.accurate_bit_estimate = 0;
      }
      (cpi->sf).rt_sf.estimate_motion_for_var_based_partition = 1;
      if ((cpi->ppi->rtc_ref).bias_recovery_frame == true) {
        (cpi->sf).mv_sf.search_method = '\x01';
        (cpi->sf).mv_sf.subpel_search_method = '\0';
        (cpi->sf).rt_sf.fullpel_search_step_param = 8;
        (cpi->sf).rt_sf.nonrd_aggressive_skip = 0;
      }
    }
    if ((cpi->oxcf).tune_cfg.content == AOM_CONTENT_SCREEN) {
      if (6 < speed) {
        (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion = 1;
        (cpi->sf).mv_sf.use_bsize_dependent_search_method = 0;
        (cpi->sf).rt_sf.skip_cdef_sb = 1;
        (cpi->sf).rt_sf.increase_color_thresh_palette = true;
        if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
          (cpi->sf).rt_sf.dct_only_palette_nonrd = 1;
        }
      }
      if (7 < speed) {
        (cpi->sf).rt_sf.nonrd_check_partition_merge_mode = 3;
        (cpi->sf).rt_sf.nonrd_prune_ref_frame_search = 1;
        (cpi->sf).rt_sf.use_nonrd_filter_search = 0;
        (cpi->sf).rt_sf.prune_hv_pred_modes_using_src_sad = false;
      }
      if (8 < speed) {
        (cpi->sf).rt_sf.prune_idtx_nonrd = 1;
        (cpi->sf).rt_sf.part_early_exit_zeromv = 2;
        (cpi->sf).rt_sf.skip_lf_screen = 1;
        (cpi->sf).rt_sf.nonrd_prune_ref_frame_search = 3;
        (cpi->sf).rt_sf.var_part_split_threshold_shift = 10;
        (cpi->sf).mv_sf.subpel_search_method = '\x02';
        (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion = 3;
        (cpi->sf).rt_sf.reduce_mv_pel_precision_lowcomplex = 1;
        (cpi->sf).lpf_sf.cdef_pick_method = CDEF_PICK_FROM_Q;
        (cpi->sf).rt_sf.nonrd_check_partition_merge_mode = 0;
        (cpi->sf).interp_sf.cb_pred_filter_search = 0;
      }
      if (9 < speed) {
        if (0x1fa400 < (cpi->common).height * (cpi->common).width) {
          (cpi->sf).part_sf.disable_8x8_part_based_on_qidx = 1;
        }
        (cpi->sf).rt_sf.screen_content_cdef_filter_qindex_thresh = 0x50;
        (cpi->sf).rt_sf.nonrd_aggressive_skip = 1;
        (cpi->sf).rt_sf.thresh_active_maps_skip_lf_cdef = 0x5a;
        (cpi->sf).rt_sf.part_early_exit_zeromv = 1;
        (cpi->sf).rt_sf.hybrid_intra_pickmode = 0;
        (cpi->sf).rt_sf.prune_palette_search_nonrd = 1;
        (cpi->sf).rt_sf.dct_only_palette_nonrd = 1;
        (cpi->sf).rt_sf.prune_intra_mode_using_best_sad_so_far = true;
        (cpi->sf).rt_sf.rc_faster_convergence_static = 1;
        (cpi->sf).rt_sf.rc_compute_spatial_var_sc = 1;
      }
      if (10 < speed) {
        (cpi->sf).rt_sf.skip_lf_screen = 2;
        (cpi->sf).rt_sf.skip_cdef_sb = 2;
        (cpi->sf).rt_sf.prune_palette_search_nonrd = 2;
        (cpi->sf).rt_sf.increase_color_thresh_palette = false;
        (cpi->sf).rt_sf.prune_h_pred_using_best_mode_so_far = true;
        (cpi->sf).rt_sf.enable_intra_mode_pruning_using_neighbors = true;
      }
      if (((0xb < speed) && ((cpi->rc).high_source_sad != 0)) &&
         ((40000 < (cpi->rc).frame_source_sad &&
          (((cpi->rc).prev_avg_source_sad < 1000 &&
           (0xe0fff < (cpi->oxcf).frm_dim_cfg.height * (cpi->oxcf).frm_dim_cfg.width)))))) {
        (cpi->sf).rt_sf.prune_palette_search_nonrd = 3;
        (cpi->sf).rt_sf.skip_newmv_mode_sad_screen = 1;
      }
      (cpi->sf).rt_sf.skip_encoding_non_reference_slide_change =
           (uint)(0 < (cpi->oxcf).rc_cfg.drop_frames_water_mark);
      (cpi->sf).rt_sf.higher_thresh_scene_detection = 0;
      (cpi->sf).rt_sf.skip_newmv_flat_blocks_screen = 1;
      (cpi->sf).rt_sf.use_nonrd_altref_frame = 0;
      (cpi->sf).rt_sf.use_comp_ref_nonrd = 0;
      (cpi->sf).rt_sf.use_rtc_tf = 0;
      (cpi->sf).rt_sf.use_idtx_nonrd = 1;
      (cpi->sf).rt_sf.source_metrics_sb_nonrd = 1;
      iVar17 = (cpi->rc).high_source_sad;
      if (iVar17 == 1) {
        (cpi->sf).rt_sf.prefer_large_partition_blocks = 0;
        (cpi->sf).part_sf.max_intra_bsize = BLOCK_128X128;
        uVar9 = 0;
        do {
          iVar15 = 7;
          if (9 < uVar9) {
            iVar15 = 1;
          }
          (cpi->sf).rt_sf.intra_y_mode_bsize_mask_nrd[uVar9] = iVar15;
          uVar9 = uVar9 + 1;
        } while (uVar9 != 0x10);
      }
      if ((speed < 0xb) || ((cpi->rc).high_motion_content_screen_rtc == 0)) {
        if (((20000 < (cpi->rc).max_block_source_sad) &&
            ((5 < speed && (100 < (cpi->rc).frame_source_sad)))) &&
           ((1 < (cpi->rc).percent_blocks_with_motion || ((cpi->svc).last_layer_dropped[0] == true))
           )) {
          (cpi->sf).mv_sf.search_method = '\x01';
          (cpi->sf).rt_sf.fullpel_search_step_param = 2;
        }
      }
      else {
        (cpi->sf).rt_sf.higher_thresh_scene_detection = 1;
        (cpi->sf).rt_sf.use_nonrd_filter_search = 0;
        (cpi->sf).part_sf.fixed_partition_size = BLOCK_32X32;
        (cpi->sf).rt_sf.use_fast_fixed_part = 1;
        (cpi->sf).rt_sf.increase_source_sad_thresh = 1;
        (cpi->sf).rt_sf.selective_cdf_update = 1;
        (cpi->sf).rt_sf.force_only_last_ref = 1;
        (cpi->sf).mv_sf.search_method = '\b';
      }
      if ((iVar17 != 0) && ((cpi->ppi->rtc_ref).non_reference_frame != 0)) {
        (cpi->sf).rt_sf.use_idtx_nonrd = 0;
        (cpi->sf).rt_sf.prefer_large_partition_blocks = 1;
        (cpi->sf).mv_sf.subpel_search_method = '\x02';
        (cpi->sf).rt_sf.fullpel_search_step_param = 10;
      }
      (cpi->sf).rt_sf.partition_direct_merging = 0;
      (cpi->sf).hl_sf.accurate_bit_estimate = 0;
      (cpi->sf).rt_sf.estimate_motion_for_var_based_partition =
           (uint)((cpi->sf).rt_sf.use_nonrd_pick_mode != 0);
    }
    if (((cpi->oxcf).rc_cfg.best_allowed_q == 0) && ((cpi->oxcf).rc_cfg.worst_allowed_q == 0)) {
      (cpi->sf).rt_sf.use_rtc_tf = 0;
      (cpi->sf).hl_sf.accurate_bit_estimate = 0;
    }
    if ((cpi->oxcf).use_highbitdepth == true) {
      (cpi->sf).rt_sf.estimate_motion_for_var_based_partition = 0;
    }
    if ((cpi->oxcf).superres_cfg.enable_superres == true) {
      (cpi->sf).rt_sf.use_rtc_tf = 0;
      (cpi->sf).rt_sf.nonrd_prune_ref_frame_search = 1;
    }
    if (((((cpi->ppi->b_calculate_psnr != 0) && ((cpi->oxcf).pass != AOM_RC_FIRST_PASS)) &&
         (cpi->compressor_stage != '\x01')) &&
        (((cpi->common).show_frame != 0 && (cpi->is_dropped_frame == false)))) &&
       (((cpi->oxcf).frm_dim_cfg.width != (cpi->common).width ||
        ((cpi->oxcf).frm_dim_cfg.height != (cpi->common).height)))) {
      (cpi->sf).rt_sf.use_rtc_tf = 0;
    }
  }
  else if (MVar2 == '\0') {
    iVar17 = (cpi->common).width;
    iVar15 = (cpi->common).height;
    if (iVar17 < iVar15) {
      iVar15 = iVar17;
    }
    bVar6 = (cpi->ppi->gf_group).update_type[cpi->gf_frame_index];
    bVar3 = (cpi->common).current_frame.frame_type;
    bVar22 = (bVar3 & 0xfd) == 0;
    bVar23 = (bVar6 & 0xfe) == 2;
    bVar24 = bVar6 != 6;
    _Var8 = (cpi->oxcf).use_highbitdepth;
    if (iVar15 < 0x1e0) {
      (cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_64X64;
      (cpi->sf).part_sf.auto_max_partition_based_on_simple_motion = '\x01';
      if (_Var8 != false) {
        (cpi->sf).tx_sf.prune_tx_size_level = 1;
      }
    }
    else {
      (cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_128X128;
      if (iVar15 < 0x2d0) {
        (cpi->sf).part_sf.auto_max_partition_based_on_simple_motion = '\x02';
      }
      else {
        (cpi->sf).part_sf.auto_max_partition_based_on_simple_motion = '\x03';
      }
    }
    if (0x86f < iVar15) {
      (cpi->sf).part_sf.default_min_partition_size = BLOCK_8X8;
    }
    if (iVar15 < 0x2d0) {
      (cpi->sf).part_sf.ml_partition_search_breakout_thresh[0] = 200;
      (cpi->sf).part_sf.ml_partition_search_breakout_thresh[1] = 0xfa;
      (cpi->sf).part_sf.ml_partition_search_breakout_thresh[2] = 300;
      (cpi->sf).part_sf.ml_partition_search_breakout_thresh[3] = 500;
      (cpi->sf).part_sf.ml_partition_search_breakout_thresh[4] = -1;
      (cpi->sf).part_sf.ml_early_term_after_part_split_level = 1;
      iVar17 = (cpi->oxcf).rc_cfg.under_shoot_pct;
      iVar14 = (cpi->oxcf).rc_cfg.over_shoot_pct;
      if (iVar17 < iVar14) {
        iVar14 = iVar17;
      }
      (cpi->sf).hl_sf.recode_tolerance = (iVar14 >> 2) + 0x19;
    }
    else {
      (cpi->sf).mv_sf.use_downsampled_sad = 2;
    }
    if (0 < speed) {
      if (iVar15 < 0x1e1) {
        (cpi->sf).inter_sf.skip_newmv_in_drl = 1;
      }
      BVar13 = BLOCK_128X128;
      if (iVar15 < 0x2d0) {
        BVar13 = (0x1df < iVar15) * '\x03' + BLOCK_32X32;
      }
      (cpi->sf).part_sf.use_square_partition_only_threshold = BVar13;
      if (iVar15 < 0x2d0) {
        (cpi->sf).part_sf.ml_partition_search_breakout_thresh[0] = 200;
        (cpi->sf).part_sf.ml_partition_search_breakout_thresh[1] = 0xfa;
        (cpi->sf).part_sf.ml_partition_search_breakout_thresh[2] = 300;
        (cpi->sf).part_sf.ml_partition_search_breakout_thresh[3] = 300;
        (cpi->sf).part_sf.ml_partition_search_breakout_thresh[4] = -1;
      }
      (cpi->sf).part_sf.ml_early_term_after_part_split_level = 2;
      (cpi->sf).lpf_sf.cdef_pick_method = CDEF_FAST_SEARCH_LVL1;
    }
    if (1 < speed) {
      iVar21 = 0x1000000;
      if (iVar15 < 0x2d0) {
        iVar21 = 0x400000;
      }
      iVar17 = 0x78;
      if (iVar15 < 0x2d0) {
        iVar17 = 100;
      }
      (cpi->sf).part_sf.use_square_partition_only_threshold =
           (0x2cf < iVar15) * '\x03' + BLOCK_32X32;
      (cpi->sf).part_sf.partition_search_breakout_dist_thr = iVar21;
      (cpi->sf).part_sf.partition_search_breakout_rate_thr = iVar17;
      (cpi->sf).inter_sf.prune_obmc_prob_thresh = (uint)(0x2cf < iVar15) * 8 + 8;
      (cpi->sf).inter_sf.disable_interintra_wedge_var_thresh = -(uint)(iVar15 < 0x1e0) | 100;
      if (iVar15 < 0x1e1) {
        (cpi->sf).inter_sf.skip_ext_comp_nearmv_mode = 1;
      }
      uVar11 = (uint)(bVar6 == 1) * 2;
      if (0x2cf < iVar15) {
        uVar11 = (uint)(bVar6 == 1);
      }
      (cpi->sf).inter_sf.limit_inter_mode_cands = uVar11;
      if (iVar15 < 0x1e0) {
        if (_Var8 != false) {
          (cpi->sf).tx_sf.prune_tx_size_level = 3;
        }
        uVar11 = (uint)(!bVar22 && !bVar23);
        (cpi->sf).tx_sf.tx_type_search.winner_mode_tx_type_pruning = (uint)(!bVar22 && !bVar23);
        lVar12 = 0x60c34;
LAB_0022cae4:
        *(uint *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar12) = uVar11;
      }
      else {
        (cpi->sf).tx_sf.tx_type_search.prune_tx_type_using_stats = 1;
        if (_Var8 != false) {
          uVar11 = 2;
          lVar12 = 0x60c10;
          goto LAB_0022cae4;
        }
      }
      iVar17 = 1;
      if (0x2cf < iVar15) {
        iVar17 = (uint)(!bVar22 && !bVar23) * 2;
      }
      (cpi->sf).mv_sf.disable_second_mv = iVar17;
      (cpi->sf).mv_sf.auto_mv_step_size = (iVar15 < 0x2d0) + 1;
      if (iVar15 < 0x2d0) {
        (cpi->sf).hl_sf.recode_tolerance = 0x32;
        (cpi->sf).inter_sf.disable_interinter_wedge_newmv_search =
             (uint)(bVar24 && (!bVar22 && !bVar23));
        (cpi->sf).inter_sf.enable_fast_wedge_mask_search = 1;
      }
    }
    if (2 < speed) {
      bVar18 = !bVar22 && !bVar23;
      (cpi->sf).inter_sf.enable_fast_wedge_mask_search = 1;
      (cpi->sf).inter_sf.skip_newmv_in_drl = 2;
      (cpi->sf).inter_sf.skip_ext_comp_nearmv_mode = 1;
      (cpi->sf).inter_sf.limit_inter_mode_cands = (uint)(bVar6 == 1) * 3;
      uVar11 = (uint)bVar18;
      (cpi->sf).inter_sf.disable_interinter_wedge_newmv_search = (uint)bVar18;
      (cpi->sf).tx_sf.tx_type_search.winner_mode_tx_type_pruning = 1;
      (cpi->sf).winner_mode_sf.enable_winner_mode_for_tx_size_srch = (uint)((bVar3 & 0xfd) != 0);
      (cpi->sf).part_sf.ml_early_term_after_part_split_level = 0;
      if (iVar15 < 0x2d0) {
        uVar10 = (uint)(bVar6 == 1);
        (cpi->sf).part_sf.max_intra_bsize = BLOCK_32X32;
        (cpi->sf).part_sf.partition_search_breakout_dist_thr = 0x800000;
        (cpi->sf).part_sf.partition_search_breakout_rate_thr = 0x78;
      }
      else {
        (cpi->sf).part_sf.partition_search_breakout_dist_thr = 0x2000000;
        (cpi->sf).part_sf.partition_search_breakout_rate_thr = 200;
        uVar10 = (uint)(bVar6 == 1) * 2;
      }
      (cpi->sf).part_sf.skip_non_sq_part_based_on_none = uVar10;
      if (_Var8 != false) {
        (cpi->sf).tx_sf.prune_tx_size_level = 3;
      }
      uVar10 = 1;
      if (!bVar22 && !bVar23) {
        uVar10 = iVar15 < 0x2d0 | 2;
      }
      (cpi->sf).part_sf.early_term_after_none_split = (uint)(0x1df < iVar15);
      (cpi->sf).intra_sf.skip_intra_in_interframe = uVar10;
      if (iVar15 < 0x2d0) {
        (cpi->sf).inter_sf.disable_interinter_wedge_var_thresh = 0xffffffff;
        iVar17 = (uint)bVar18 * 2;
        uVar11 = 2;
        lVar12 = 0x60c64;
        lVar20 = 0x60b34;
      }
      else {
        lVar12 = 0x60b34;
        iVar17 = 100;
        lVar20 = 0x60aec;
      }
      *(int *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar20) = iVar17;
      *(uint *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar12) = uVar11;
      (cpi->sf).inter_sf.disable_interintra_wedge_var_thresh = 0xffffffff;
    }
    if (3 < speed) {
      iVar21 = 0x4000000;
      if (iVar15 < 0x2d0) {
        iVar21 = 0x1000000;
      }
      (cpi->sf).tx_sf.tx_type_search.winner_mode_tx_type_pruning = 2;
      (cpi->sf).winner_mode_sf.enable_winner_mode_for_tx_size_srch = 1;
      (cpi->sf).part_sf.partition_search_breakout_dist_thr = iVar21;
      (cpi->sf).part_sf.early_term_after_none_split = 1;
      if (iVar15 < 0x1e0) {
        (cpi->sf).mv_sf.skip_fullpel_search_using_startmv = (uint)(!bVar22 && !bVar23);
      }
      else {
        (cpi->sf).tx_sf.tx_type_search.prune_tx_type_using_stats = 2;
      }
      (cpi->sf).inter_sf.disable_interinter_wedge_var_thresh = 0xffffffff;
      (cpi->sf).inter_sf.prune_obmc_prob_thresh = 0x7fffffff;
      (cpi->sf).inter_sf.limit_txfm_eval_per_mode = (uint)(!bVar22 && !bVar23) * 2;
      if (iVar15 < 0x1e1) {
        (cpi->sf).inter_sf.skip_newmv_in_drl = 3;
      }
      uVar11 = 1;
      if (iVar15 < 0x2d0) {
        if (0x1df < iVar15) {
          uVar11 = (uint)(bVar24 && (!bVar22 && !bVar23));
          goto LAB_0022cd58;
        }
      }
      else {
LAB_0022cd58:
        (cpi->sf).inter_sf.prune_comp_ref_frames = uVar11;
      }
      iVar17 = 0x20;
      if (iVar15 < 0x2d0) {
        iVar17 = 0x37;
      }
      (cpi->sf).hl_sf.recode_tolerance = iVar17;
      (cpi->sf).intra_sf.skip_intra_in_interframe = 4;
      (cpi->sf).lpf_sf.cdef_pick_method = CDEF_FAST_SEARCH_LVL3;
    }
    _Var8 = (cpi->common).features.allow_screen_content_tools;
    if (4 < speed) {
      if (0x1df < iVar15) {
        (cpi->sf).inter_sf.prune_warped_prob_thresh = (uint)(0x2cf < iVar15) * 8 + 8;
      }
      if (iVar15 < 0x2d0) {
        (cpi->sf).inter_sf.prune_comp_ref_frames = 1;
        (cpi->sf).inter_sf.skip_newmv_in_drl = 4;
        (cpi->sf).mv_sf.skip_fullpel_search_using_startmv = (uint)(!bVar22 && !bVar23);
        (cpi->sf).inter_sf.mv_cost_upd_level = INTERNAL_COST_UPD_SBROW_SET;
        (cpi->sf).inter_sf.prune_nearest_near_mv_using_refmv_weight =
             (byte)~((bVar22 || bVar23) | _Var8) & 1;
        (cpi->sf).mv_sf.use_downsampled_sad = 1;
      }
      else {
        (cpi->sf).hl_sf.recode_tolerance = 0x28;
        (cpi->sf).inter_sf.prune_comp_ref_frames = 1;
        (cpi->sf).inter_sf.skip_newmv_in_drl = 4;
        (cpi->sf).mv_sf.skip_fullpel_search_using_startmv = (uint)(!bVar22 && !bVar23);
      }
      if (iVar15 < 0x1e0) {
        (cpi->sf).part_sf.partition_search_breakout_dist_thr = 0x4000000;
      }
      (cpi->sf).inter_sf.prune_nearmv_using_neighbors = '\x02' - (iVar15 < 0x1e1);
      if (0x2cf < iVar15) {
        uVar11 = 0;
        if (_Var8 == false) {
          uVar11 = (uint)(((cpi->common).current_frame.frame_type & 0xfd) != 0);
        }
        (cpi->sf).part_sf.ext_part_eval_based_on_cur_best = uVar11;
      }
      if (0x1df < iVar15) {
        (cpi->sf).tpl_sf.reduce_num_frames = 1;
      }
    }
    if (5 < speed) {
      (cpi->sf).tx_sf.tx_type_search.winner_mode_tx_type_pruning = 4;
      (cpi->sf).inter_sf.prune_nearmv_using_neighbors = '\x03';
      (cpi->sf).inter_sf.prune_comp_ref_frames = 2;
      (cpi->sf).inter_sf.prune_nearest_near_mv_using_refmv_weight =
           (byte)~(_Var8 | (bVar22 || bVar23)) & 1;
      (cpi->sf).mv_sf.skip_fullpel_search_using_startmv = (uint)(!bVar22 && !bVar23) * 2;
      if (0x1df < iVar15) {
        (cpi->sf).part_sf.auto_max_partition_based_on_simple_motion = iVar15 < 0x2d0;
        (cpi->sf).hl_sf.allow_sub_blk_me_in_tf = 1;
      }
      if (0x437 < iVar15) {
        (cpi->sf).part_sf.default_min_partition_size = BLOCK_8X8;
      }
      if (iVar15 < 0x2d0) {
        (cpi->sf).inter_sf.coeff_cost_upd_level = INTERNAL_COST_UPD_SBROW;
        (cpi->sf).inter_sf.mode_cost_upd_level = INTERNAL_COST_UPD_SBROW;
        (cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_16X16;
        (cpi->sf).part_sf.partition_search_breakout_dist_thr = 0x4000000;
        (cpi->sf).inter_sf.prune_ref_mv_idx_search = 1;
        uVar16 = 0x96;
        if (!bVar24 || (bVar22 || bVar23)) {
          uVar16 = 0x1c2;
        }
        lVar12 = 0x60be0;
      }
      else {
        (cpi->sf).inter_sf.disable_masked_comp = 1;
        (cpi->sf).part_sf.use_square_partition_only_threshold = BLOCK_32X32;
        (cpi->sf).part_sf.partition_search_breakout_dist_thr = 0x10000000;
        uVar16 = 2;
        lVar12 = 0x60ad8;
      }
      *(undefined4 *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar12) = uVar16
      ;
      (cpi->sf).lpf_sf.cdef_pick_method = CDEF_FAST_SEARCH_LVL4;
      (cpi->sf).hl_sf.recode_tolerance = 0x37;
    }
    if ((0xfffffffc < speed - 4U) && ((cpi->oxcf).enable_low_complexity_decode != 0)) {
      iVar17 = (cpi->common).width;
      iVar15 = (cpi->common).height;
      if (iVar17 < iVar15) {
        iVar15 = iVar17;
      }
      bVar6 = (cpi->ppi->gf_group).update_type[cpi->gf_frame_index];
      if (0x25f < iVar15) {
        uVar11 = 0;
        if ((byte)(bVar6 - 6) < 0xfe) {
          uVar11 = (uint)(1 < (cpi->common).current_frame.pyramid_level);
        }
        (cpi->sf).lpf_sf.skip_loop_filter_using_filt_error = uVar11;
      }
      if (iVar15 - 0x1e1U < 0xef) {
        if ((bVar6 < 6) && ((0x32U >> (bVar6 & 0x1f) & 1) != 0)) {
          (cpi->sf).gm_sf.gm_search_type = '\x04';
        }
        (cpi->sf).hl_sf.disable_ref_frame_mvs = 1;
      }
      else if (0x25f < iVar15) {
        (cpi->sf).gm_sf.gm_erroradv_tr_level = 1;
      }
    }
  }
  if (cpi->ppi->seq_params_locked == 0) {
    pSVar5 = (cpi->common).seq_params;
    pSVar5->enable_masked_compound =
         pSVar5->enable_masked_compound & (cpi->sf).inter_sf.disable_masked_comp == 0;
    bVar6 = pSVar5->enable_interintra_compound & 1;
    if ((cpi->sf).inter_sf.disable_interintra_wedge_var_thresh == 0xffffffff) {
      bVar6 = 0;
    }
    pSVar5->enable_interintra_compound = bVar6;
  }
  uVar11 = (cpi->oxcf).unit_test_cfg.motion_vector_unit_test;
  (cpi->mv_search_params).find_fractional_mv_step =
       fractional_mv_search[(cpi->sf).mv_sf.subpel_search_method];
  if (uVar11 == 1) {
    pcVar7 = av1_return_max_sub_pixel_mv;
  }
  else {
    if (uVar11 != 2) goto LAB_0022d0aa;
    pcVar7 = av1_return_min_sub_pixel_mv;
  }
  (cpi->mv_search_params).find_fractional_mv_step = pcVar7;
LAB_0022d0aa:
  if ((((cpi->oxcf).row_mt == true) && (1 < (cpi->mt_info).num_workers)) &&
     ((cpi->sf).inter_sf.mv_cost_upd_level == INTERNAL_COST_UPD_SBROW_SET)) {
    (cpi->sf).inter_sf.mv_cost_upd_level = INTERNAL_COST_UPD_SBROW;
  }
  return;
}

Assistant:

void av1_set_speed_features_framesize_dependent(AV1_COMP *cpi, int speed) {
  SPEED_FEATURES *const sf = &cpi->sf;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;

  switch (oxcf->mode) {
    case GOOD:
      set_good_speed_feature_framesize_dependent(cpi, sf, speed);
      break;
    case ALLINTRA:
      set_allintra_speed_feature_framesize_dependent(cpi, sf, speed);
      break;
    case REALTIME:
      set_rt_speed_feature_framesize_dependent(cpi, sf, speed);
      break;
  }

  if (!cpi->ppi->seq_params_locked) {
    cpi->common.seq_params->enable_masked_compound &=
        !sf->inter_sf.disable_masked_comp;
    cpi->common.seq_params->enable_interintra_compound &=
        (sf->inter_sf.disable_interintra_wedge_var_thresh != UINT_MAX);
  }

  set_subpel_search_method(&cpi->mv_search_params,
                           cpi->oxcf.unit_test_cfg.motion_vector_unit_test,
                           sf->mv_sf.subpel_search_method);

  // For multi-thread use case with row_mt enabled, cost update for a set of
  // SB rows is not desirable. Hence, the sf mv_cost_upd_level is set to
  // INTERNAL_COST_UPD_SBROW in such cases.
  if ((cpi->oxcf.row_mt == 1) && (cpi->mt_info.num_workers > 1)) {
    if (sf->inter_sf.mv_cost_upd_level == INTERNAL_COST_UPD_SBROW_SET) {
      // Set mv_cost_upd_level to use row level update.
      sf->inter_sf.mv_cost_upd_level = INTERNAL_COST_UPD_SBROW;
    }
  }
}